

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O1

btree_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
* __thiscall
google::protobuf::descriptor_unittest::DescriptorTest_FieldNamesDedupOnOptimizedCases_Test::TestBody
::anon_class_1_0_00000001::operator()
          (btree_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           *__return_storage_ptr__,anon_class_1_0_00000001 *this,FieldDescriptor *field)

{
  ushort *puVar1;
  btree_set<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *value;
  char *message;
  AssertionResult gtest_ar;
  allocator_type local_9b;
  key_equal local_9a;
  hasher local_99;
  AssertHelper local_98;
  allocator_type local_90 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_80;
  long local_78;
  long local_70;
  long local_68;
  string local_60;
  ulong local_40;
  long local_38;
  ulong local_30;
  long local_28;
  ulong local_20;
  
  puVar1 = *(ushort **)(this + 8);
  local_60._M_dataplus._M_p = (pointer)(ulong)*puVar1;
  local_60._M_string_length = ~(ulong)local_60._M_dataplus._M_p + (long)puVar1;
  local_60.field_2._M_allocated_capacity = (size_type)puVar1[3];
  local_60.field_2._8_8_ = (long)puVar1 - (ulong)puVar1[2];
  local_40 = (ulong)puVar1[5];
  local_38 = (long)puVar1 - (ulong)puVar1[4];
  local_30 = (ulong)puVar1[7];
  local_28 = (long)puVar1 - (ulong)puVar1[6];
  absl::lts_20250127::container_internal::
  btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,std::char_traits<char>>,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,256,false>>>
  ::btree_set_container<std::basic_string_view<char,std::char_traits<char>>const*>
            ((btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,std::char_traits<char>>,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,256,false>>>
              *)__return_storage_ptr__,(basic_string_view<char,_std::char_traits<char>_> *)&local_60
             ,(basic_string_view<char,_std::char_traits<char>_> *)&local_20,(key_compare *)&local_80
             ,local_90);
  local_98.data_ =
       (AssertHelperData *)
       (__return_storage_ptr__->
       super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_256,_false>_>_>
       ).
       super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<std::basic_string_view<char,_std::char_traits<char>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_256,_false>_>_>
       .tree_.size_;
  puVar1 = *(ushort **)(this + 8);
  local_80._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (~(ulong)*puVar1 + (long)puVar1);
  local_78 = (long)puVar1 - (ulong)puVar1[2];
  local_70 = (long)puVar1 - (ulong)puVar1[4];
  local_68 = (long)puVar1 - (ulong)puVar1[6];
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<void_const*>,absl::lts_20250127::container_internal::HashEq<void_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<void_const*,void>::Eq,std::allocator<void_const*>>
  ::raw_hash_set<char_const*const*>
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<void_const*>,absl::lts_20250127::container_internal::HashEq<void_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<void_const*,void>::Eq,std::allocator<void_const*>>
              *)&local_60,(char **)&local_80,(char **)&local_60,0,&local_99,&local_9a,&local_9b);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_void_*>,_absl::lts_20250127::container_internal::HashEq<const_void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_void_*,_void>::Eq,_std::allocator<const_void_*>_>
  ::AssertNotDebugCapacity
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_void_*>,_absl::lts_20250127::container_internal::HashEq<const_void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_void_*,_void>::Eq,_std::allocator<const_void_*>_>
              *)&local_60);
  local_20 = local_60._M_string_length >> 1;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_90,"names.size()",
             "(absl::flat_hash_set<const void*>{ field->name().data(), field->lowercase_name().data(), field->camelcase_name().data(), field->json_name().data()} .size())"
             ,(unsigned_long *)&local_98,&local_20);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_void_*>,_absl::lts_20250127::container_internal::HashEq<const_void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_void_*,_void>::Eq,_std::allocator<const_void_*>_>
  ::destructor_impl((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_void_*>,_absl::lts_20250127::container_internal::HashEq<const_void_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_void_*,_void>::Eq,_std::allocator<const_void_*>_>
                     *)&local_60);
  if (local_90[0] == (allocator_type)0x0) {
    testing::Message::Message((Message *)&local_80);
    testing::
    PrintToString<absl::lts_20250127::btree_set<std::basic_string_view<char,std::char_traits<char>>,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>>
              (&local_60,(testing *)__return_storage_ptr__,value);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_80._M_head_impl + 0x10),local_60._M_dataplus._M_p,
               local_60._M_string_length);
    if (local_88 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = anon_var_dwarf_a12c75 + 5;
    }
    else {
      message = (local_88->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x3c8,message);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    if (local_80._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_80._M_head_impl + 8))();
    }
  }
  if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_88,local_88);
  }
  return __return_storage_ptr__;
}

Assistant:

TEST_F(DescriptorTest, FieldNamesDedupOnOptimizedCases) {
  const auto collect_unique_names = [](const FieldDescriptor* field) {
    absl::btree_set<absl::string_view> names{
        field->name(), field->lowercase_name(), field->camelcase_name(),
        field->json_name()};
    // For names following the style guide, verify that we have the same number
    // of string objects as we have string values. That is, duplicate names use
    // the same std::string object. This is for memory efficiency.
    EXPECT_EQ(names.size(),
              (absl::flat_hash_set<const void*>{
                  field->name().data(), field->lowercase_name().data(),
                  field->camelcase_name().data(), field->json_name().data()}
                   .size()))
        << testing::PrintToString(names);
    return names;
  };

  // field_name1
  EXPECT_THAT(collect_unique_names(message4_->field(0)),
              ElementsAre("fieldName1", "field_name1"));
  // fieldname7
  EXPECT_THAT(collect_unique_names(message4_->field(6)),
              ElementsAre("fieldname7"));
}